

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O2

void __thiscall Blip_Impulse_::treble_eq(Blip_Impulse_ *this,blip_eq_t *new_eq)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  imp_t *piVar20;
  int w;
  int iVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  int local_638;
  float buf [352];
  
  if ((((this->generate != false) || (new_eq->treble != (this->eq).treble)) ||
      (NAN(new_eq->treble) || NAN((this->eq).treble))) ||
     ((new_eq->cutoff != (this->eq).cutoff || (new_eq->sample_rate != (this->eq).sample_rate)))) {
    this->generate = false;
    lVar19 = new_eq->cutoff;
    (this->eq).treble = new_eq->treble;
    (this->eq).cutoff = lVar19;
    (this->eq).sample_rate = new_eq->sample_rate;
    dVar4 = pow(10.0,(this->eq).treble * 0.05);
    auVar28._0_8_ = (double)(this->eq).sample_rate;
    auVar27._0_8_ = (double)((this->eq).cutoff * 2);
    auVar27._8_8_ = 0x40e5888000000000;
    auVar28._8_8_ = auVar28._0_8_;
    auVar28 = divpd(auVar27,auVar28);
    dVar29 = auVar28._0_8_;
    bVar22 = auVar28._8_8_ * 0.95 <= dVar29;
    bVar3 = 0.95 <= dVar29;
    if (bVar3 || bVar22) {
      dVar29 = 0.5;
    }
    dVar24 = 1.0;
    if ((!bVar3 && !bVar22) && (dVar24 = 5e-06, 5e-06 <= dVar4)) {
      dVar24 = dVar4;
    }
    dVar29 = dVar29 * 4096.0;
    dVar4 = pow(dVar24,1.0 / (auVar28._8_8_ * 4096.0 - dVar29));
    dVar24 = pow(dVar4,dVar29);
    dVar5 = pow(dVar4,4096.0);
    dVar5 = dVar5 * (1.0 / dVar24);
    dVar6 = pow(dVar4,dVar29);
    dVar6 = dVar6 * (1.0 / dVar24);
    iVar1 = this->width;
    uVar18 = iVar1 * 0x10 + 0x7fffffe0;
    iVar14 = uVar18 * 2 + -1;
    lVar19 = (long)((ulong)uVar18 << 0x21) >> 0x21;
    dVar24 = 0.0;
    while (lVar19 = lVar19 + -1, lVar19 != -1) {
      dVar7 = (double)iVar14 * 1.1984224905356572e-05;
      dVar23 = cos(dVar7);
      dVar8 = cos(dVar29 * dVar7);
      dVar9 = cos((dVar29 + -1.0) * dVar7);
      dVar25 = dVar23 * -2.0 + 2.0;
      dVar26 = dVar4 * (dVar4 - (dVar23 + dVar23)) + 1.0;
      dVar10 = cos(dVar7 * 4095.0);
      dVar11 = cos(dVar7 * 4096.0);
      dVar23 = ((((1.0 - dVar23) - dVar8) + dVar9) * dVar26 +
               (dVar8 * dVar6 + dVar9 * -dVar6 * dVar4 + dVar10 * dVar4 * dVar5 + dVar11 * -dVar5) *
               dVar25) / (dVar26 * dVar25);
      if (0xc < this->width) {
        dVar7 = cos(dVar7 * 136.53333333333333);
        dVar23 = dVar23 * dVar7 * dVar7;
      }
      dVar24 = dVar24 + (double)(float)dVar23;
      buf[lVar19] = (float)dVar23;
      iVar14 = iVar14 + -2;
    }
    piVar20 = this->impulse;
    iVar14 = this->res;
    local_638 = iVar14 / 2 + 1;
    iVar2 = this->width;
    iVar15 = iVar2 / -2;
    iVar16 = (uint)(1 < iVar14) * 0x10 + iVar15 * 0x20 + 0xf;
    while (bVar22 = local_638 != 0, local_638 = local_638 + -1, iVar17 = iVar16, iVar21 = iVar15,
          bVar22) {
      for (; iVar21 < iVar2 / 2; iVar21 = iVar21 + 1) {
        dVar4 = 0.0;
        iVar13 = 0x20;
        while (iVar12 = iVar13 + -1, iVar13 != 0) {
          uVar18 = iVar13 + iVar17 >> 0x1f ^ iVar13 + iVar17;
          iVar13 = iVar12;
          if ((int)uVar18 < iVar1 * 0x20 + -0x40 >> 1) {
            dVar4 = dVar4 + (double)buf[uVar18];
          }
        }
        dVar4 = floor(dVar4 * (16384.0 / dVar24) + 16384.5);
        *piVar20 = (imp_t)(int)dVar4;
        piVar20 = piVar20 + 1;
        iVar17 = iVar17 + 0x20;
      }
      iVar16 = iVar16 - (int)(0x20 / (long)iVar14);
    }
    dVar4 = this->volume_unit_;
    if (0.0 <= dVar4) {
      this->volume_unit_ = -1.0;
      volume_unit(this,dVar4);
    }
  }
  return;
}

Assistant:

void Blip_Impulse_::treble_eq( const blip_eq_t& new_eq )
{
	if ( !generate && new_eq.treble == eq.treble && new_eq.cutoff == eq.cutoff &&
			new_eq.sample_rate == eq.sample_rate )
		return; // already calculated with same parameters
	
	generate = false;
	eq = new_eq;
	
	double treble = pow( 10.0, 1.0 / 20 * eq.treble ); // dB (-6dB = 0.50)
	if ( treble < 0.000005 )
		treble = 0.000005;
	
	const double treble_freq = 22050.0; // treble level at 22 kHz harmonic
	const double sample_rate = eq.sample_rate;
	const double pt = treble_freq * 2 / sample_rate;
	double cutoff = eq.cutoff * 2 / sample_rate;
	if ( cutoff >= pt * 0.95 || cutoff >= 0.95 ) {
		cutoff = 0.5;
		treble = 1.0;
	}
	
	// DSF Synthesis (See T. Stilson & J. Smith (1996),
	// Alias-free digital synthesis of classic analog waveforms)
	
	// reduce adjacent impulse interference by using small part of wide impulse
	const double n_harm = 4096;
	const double rolloff = pow( treble, 1.0 / (n_harm * pt - n_harm * cutoff) );
	const double rescale = 1.0 / pow( rolloff, n_harm * cutoff );
	
	const double pow_a_n = rescale * pow( rolloff, n_harm );
	const double pow_a_nc = rescale * pow( rolloff, n_harm * cutoff );
	
	double total = 0.0;
	const double to_angle = pi / 2 / n_harm / max_res;
	
	float buf [max_res * (Blip_Buffer::widest_impulse_ - 2) / 2];
	const int size = max_res * (width - 2) / 2;
	for ( int i = size; i--; )
	{
		double angle = (i * 2 + 1) * to_angle;
		
		// equivalent
		//double y =     dsf( angle, n_harm * cutoff, 1.0 );
		//y -= rescale * dsf( angle, n_harm * cutoff, rolloff );
		//y += rescale * dsf( angle, n_harm,          rolloff );
		
		const double cos_angle = cos( angle );
		const double cos_nc_angle = cos( n_harm * cutoff * angle );
		const double cos_nc1_angle = cos( (n_harm * cutoff - 1.0) * angle );
		
		double b = 2.0 - 2.0 * cos_angle;
		double a = 1.0 - cos_angle - cos_nc_angle + cos_nc1_angle;
		
		double d = 1.0 + rolloff * (rolloff - 2.0 * cos_angle);
		double c = pow_a_n * rolloff * cos( (n_harm - 1.0) * angle ) -
				pow_a_n * cos( n_harm * angle ) -
				pow_a_nc * rolloff * cos_nc1_angle +
				pow_a_nc * cos_nc_angle;
		
		// optimization of a / b + c / d
		double y = (a * d + c * b) / (b * d);
		
		// fixed window which affects wider impulses more
		if ( width > 12 ) {
			double window = cos( n_harm / 1.25 / Blip_Buffer::widest_impulse_ * angle );
			y *= window * window;
		}
		
		total += (float) y;
		buf [i] = (float) y;
	}
	
	// integrate runs of length 'max_res'
	double factor = impulse_amp * 0.5 / total; // 0.5 accounts for other mirrored half
	imp_t* imp = impulse;
	const int step = max_res / res;
	int offset = res > 1 ? max_res : max_res / 2;
	for ( int n = res / 2 + 1; n--; offset -= step )
	{
		for ( int w = -width / 2; w < width / 2; w++ )
		{
			double sum = 0;
			for ( int i = max_res; i--; )
			{
				int index = w * max_res + offset + i;
				if ( index < 0 )
					index = -index - 1;
				if ( index < size )
					sum += buf [index];
			}
			*imp++ = (imp_t) floor( sum * factor + (impulse_offset + 0.5) );
		}
	}
	
	// rescale
	double unit = volume_unit_;
	if ( unit >= 0 ) {
		volume_unit_ = -1;
		volume_unit( unit );
	}
}